

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftp.c
# Opt level: O0

CURLcode ftp_state_type(Curl_easy *data)

{
  FILEPROTO *pFVar1;
  connectdata *conn_00;
  int iVar2;
  ftp_conn *ftpc;
  connectdata *conn;
  FTP *ftp;
  CURLcode result;
  Curl_easy *data_local;
  
  pFVar1 = (data->req).p.file;
  conn_00 = data->conn;
  if ((((*(uint *)&(data->req).field_0xd1 >> 0x11 & 1) == 0) ||
      ((conn_00->proto).ftpc.file == (char *)0x0)) ||
     (iVar2 = ftp_need_type(conn_00,(*(uint *)&(data->state).field_0x7be >> 0xe & 1) != 0),
     iVar2 == 0)) {
    ftp._4_4_ = ftp_state_size(data,conn_00);
  }
  else {
    pFVar1->fd = 1;
    ftp._4_4_ = ftp_nb_type(data,conn_00,(*(uint *)&(data->state).field_0x7be >> 0xe & 1) != 0,
                            '\x13');
    if (ftp._4_4_ != CURLE_OK) {
      return ftp._4_4_;
    }
  }
  return ftp._4_4_;
}

Assistant:

static CURLcode ftp_state_type(struct Curl_easy *data)
{
  CURLcode result = CURLE_OK;
  struct FTP *ftp = data->req.p.ftp;
  struct connectdata *conn = data->conn;
  struct ftp_conn *ftpc = &conn->proto.ftpc;

  /* If we have selected NOBODY and HEADER, it means that we only want file
     information. Which in FTP cannot be much more than the file size and
     date. */
  if(data->req.no_body && ftpc->file &&
     ftp_need_type(conn, data->state.prefer_ascii)) {
    /* The SIZE command is _not_ RFC 959 specified, and therefore many servers
       may not support it! It is however the only way we have to get a file's
       size! */

    ftp->transfer = PPTRANSFER_INFO;
    /* this means no actual transfer will be made */

    /* Some servers return different sizes for different modes, and thus we
       must set the proper type before we check the size */
    result = ftp_nb_type(data, conn, data->state.prefer_ascii, FTP_TYPE);
    if(result)
      return result;
  }
  else
    result = ftp_state_size(data, conn);

  return result;
}